

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDX;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RSI;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  SizeType elementCount;
  ParseErrorCode in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar3;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_00;
  
  this_00 = in_RDI;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
            ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
  bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartArray((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)in_RDI,in_stack_ffffffffffffff9c,0x23fcfd);
    bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x23fd09);
    if (bVar1) {
      return;
    }
  }
  SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
            ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
             )CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
  bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x23fd37);
  if (!bVar1) {
    CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
    if (CVar2 == ']') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndArray(this_00,(SizeType)((ulong)in_RSI >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)in_RDI,in_stack_ffffffffffffff9c,0x23fdcb);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)0x23fdd7);
      }
    }
    else {
      iVar3 = 0;
      do {
        ParseValue<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (in_RDX,(BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *
                          )CONCAT44(iVar3,in_stack_ffffffffffffffa8),in_RDI);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23fe17);
        if (bVar1) {
          return;
        }
        iVar3 = iVar3 + 1;
        SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
                  ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                   (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI
                  );
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23fe4c);
        if (bVar1) {
          return;
        }
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (in_RSI);
        if (CVar2 == ',') {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                    ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                     in_RDI);
          SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
                    ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),
                     (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                     in_RDI);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x23fec1);
          if (bVar1) {
            return;
          }
        }
        else {
          CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (in_RSI);
          if (CVar2 == ']') {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                      ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                       in_RDI);
            bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndArray(this_00,(SizeType)((ulong)in_RSI >> 0x20));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              return;
            }
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)in_RDI,in_stack_ffffffffffffff9c,0x23ff5c);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x23ff68);
            return;
          }
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)in_RDI,in_stack_ffffffffffffff9c,0x23ffa2);
          bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)0x23ffae);
          if (bVar1) {
            return;
          }
        }
        CVar2 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (in_RSI);
      } while (CVar2 != ']');
      bVar1 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndArray(this_00,(SizeType)((ulong)in_RSI >> 0x20));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)in_RDI,in_stack_ffffffffffffff9c,0x240011);
        bVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x24001d);
        if (bVar1) {
          return;
        }
      }
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)in_RDI);
    }
  }
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '[');
        is.Take();  // Skip '['

        if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, ']')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType elementCount = 0;;) {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++elementCount;
            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (Consume(is, ',')) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            }
            else if (Consume(is, ']')) {
                if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                    RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                return;
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == ']') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }